

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtCentroidCase::init
          (InterpolateAtCentroidCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_320;
  MessageBuilder local_190;
  InterpolateAtCentroidCase *local_10;
  InterpolateAtCentroidCase *this_local;
  
  local_10 = this;
  if (this->m_type == TEST_CONSISTENCY) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [120])
                        "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [72])
                               "\tDraw a fan of narrow triangles (large number of pixels on the edges).\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [87])
                               "\tSet varyings \'barycentricsA\' and \'barycentricsB\' to contain barycentric coordinates.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [44])"\tAdd centroid-qualifier for barycentricsB.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [59])
                               "\t=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  else if (this->m_type == TEST_ARRAY_ELEMENT) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [68])
                        "Testing interpolateAtCentroid with element of array as an argument.");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  iVar1 = CentroidRenderCase::init(&this->super_CentroidRenderCase,ctx);
  return iVar1;
}

Assistant:

void InterpolateAtCentroidCase::init (void)
{
	// test purpose and expectations
	if (m_type == TEST_CONSISTENCY)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
			<< "	Draw a fan of narrow triangles (large number of pixels on the edges).\n"
			<< "	Set varyings 'barycentricsA' and 'barycentricsB' to contain barycentric coordinates.\n"
			<< "	Add centroid-qualifier for barycentricsB.\n"
			<< "	=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n"
			<< tcu::TestLog::EndMessage;
	}
	else if (m_type == TEST_ARRAY_ELEMENT)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Testing interpolateAtCentroid with element of array as an argument."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	CentroidRenderCase::init();
}